

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O2

void __thiscall cmCTestMultiProcessHandler::PrintOutputAsJson(cmCTestMultiProcessHandler *this)

{
  float fVar1;
  cmCTestTestHandler *pcVar2;
  _Base_ptr value;
  bool bVar3;
  int iVar4;
  Value *pVVar5;
  string *value_00;
  _Rb_tree_node_base *p_Var6;
  _Base_ptr p_Var7;
  StreamWriter *pSVar8;
  allocator<char> local_9a9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commandAndArgs;
  Value properties;
  Value local_950;
  cmCTestMultiProcessHandler *local_928;
  string local_920;
  _Base_ptr local_900;
  _Base_ptr local_8f8;
  _Base_ptr local_8f0;
  Value local_8e8;
  Value testInfo;
  Value result;
  Value local_870;
  Value local_848;
  Value local_820;
  Value local_7f8;
  Value local_7d0;
  string local_7a8;
  Value tests;
  Value local_760;
  Value local_738;
  Value local_710;
  Value local_6e8;
  Value local_6c0;
  Value local_698;
  Value local_670;
  Value local_648;
  ArrayIndex backtrace;
  cmWorkingDirectory workdir;
  Value local_5d0;
  Value local_5a8;
  Value local_580;
  Value local_558;
  Value local_530;
  Value local_508;
  Value local_4e0;
  Value local_4b8;
  Value local_490;
  Value local_468;
  Value local_440;
  Value local_418;
  Value local_3f0;
  Value local_3c8;
  Value local_3a0;
  StreamWriterBuilder builder;
  value_type local_1a0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_180;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_178;
  BacktraceData backtraceGraph;
  
  pcVar2 = this->TestHandler;
  local_928 = this;
  iVar4 = FindMaxIndex(this);
  pcVar2->MaxIndex = iVar4;
  Json::Value::Value(&result,objectValue);
  Json::Value::Value(&local_6c0,"ctestInfo");
  pVVar5 = Json::Value::operator[](&result,"kind");
  Json::Value::operator=(pVVar5,&local_6c0);
  Json::Value::~Value(&local_6c0);
  Json::Value::Value(&local_848,objectValue);
  Json::Value::Value((Value *)&builder,1);
  pVVar5 = Json::Value::operator[](&local_848,"major");
  Json::Value::operator=(pVVar5,(Value *)&builder);
  Json::Value::~Value((Value *)&builder);
  Json::Value::Value((Value *)&backtraceGraph,0);
  pVVar5 = Json::Value::operator[](&local_848,"minor");
  Json::Value::operator=(pVVar5,(Value *)&backtraceGraph);
  Json::Value::~Value((Value *)&backtraceGraph);
  pVVar5 = Json::Value::operator[](&result,"version");
  Json::Value::operator=(pVVar5,&local_848);
  Json::Value::~Value(&local_848);
  BacktraceData::BacktraceData(&backtraceGraph);
  Json::Value::Value(&tests,arrayValue);
  p_Var7 = (local_928->Properties).
           super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
           ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_900 = &(local_928->Properties).
               super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
               ._M_t._M_impl.super__Rb_tree_header._M_header;
  do {
    if (p_Var7 == local_900) {
      BacktraceData::Dump(&local_6e8,&backtraceGraph);
      pVVar5 = Json::Value::operator[](&result,"backtraceGraph");
      Json::Value::operator=(pVVar5,&local_6e8);
      Json::Value::~Value(&local_6e8);
      Json::Value::Value(&local_710,&tests);
      pVVar5 = Json::Value::operator[](&result,"tests");
      Json::Value::operator=(pVVar5,&local_710);
      Json::Value::~Value(&local_710);
      Json::StreamWriterBuilder::StreamWriterBuilder(&builder);
      Json::Value::Value(&local_738,"  ");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7a8,"indentation",(allocator<char> *)&commandAndArgs);
      pVVar5 = Json::StreamWriterBuilder::operator[](&builder,&local_7a8);
      Json::Value::operator=(pVVar5,&local_738);
      std::__cxx11::string::~string((string *)&local_7a8);
      Json::Value::~Value(&local_738);
      pSVar8 = Json::StreamWriterBuilder::newStreamWriter(&builder);
      (*pSVar8->_vptr_StreamWriter[2])(pSVar8,&result,&std::cout);
      (*pSVar8->_vptr_StreamWriter[1])(pSVar8);
      Json::StreamWriterBuilder::~StreamWriterBuilder(&builder);
      Json::Value::~Value(&tests);
      BacktraceData::~BacktraceData(&backtraceGraph);
      Json::Value::~Value(&result);
      return;
    }
    value = p_Var7[1]._M_parent;
    local_8f8 = value + 1;
    local_8f0 = p_Var7;
    cmWorkingDirectory::cmWorkingDirectory(&workdir,(string *)local_8f8);
    cmCTestRunTest::cmCTestRunTest((cmCTestRunTest *)&builder,local_928);
    builder.super_Factory._vptr_Factory = (_func_int **)value;
    cmCTestRunTest::ComputeArguments((cmCTestRunTest *)&builder);
    if ((ulong)((long)value[2]._M_parent - *(long *)(value + 2)) < 0x21) {
LAB_001aa447:
      Json::Value::Value(&testInfo,objectValue);
      Json::Value::Value(&local_580,(string *)value);
      pVVar5 = Json::Value::operator[](&testInfo,"name");
      Json::Value::operator=(pVVar5,&local_580);
      Json::Value::~Value(&local_580);
      value_00 = cmCTest::GetConfigType_abi_cxx11_((cmCTest *)builder.settings_.comments_);
      if (value_00->_M_string_length != 0) {
        Json::Value::Value(&local_5a8,value_00);
        pVVar5 = Json::Value::operator[](&testInfo,"config");
        Json::Value::operator=(pVVar5,&local_5a8);
        Json::Value::~Value(&local_5a8);
      }
      if (local_1a0._M_string_length != 0) {
        commandAndArgs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        commandAndArgs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        commandAndArgs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&commandAndArgs,&local_1a0);
        if (local_180._M_current != local_178._M_current) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::reserve(&commandAndArgs,
                    ((long)local_178._M_current - (long)local_180._M_current >> 5) + 1);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &commandAndArgs,
                     (const_iterator)
                     commandAndArgs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,local_180,local_178);
        }
        DumpToJsonArray(&local_5d0,&commandAndArgs);
        pVVar5 = Json::Value::operator[](&testInfo,"command");
        Json::Value::operator=(pVVar5,&local_5d0);
        Json::Value::~Value(&local_5d0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&commandAndArgs);
      }
      Json::Value::Value(&properties,arrayValue);
      if (*(_Base_ptr *)(value + 5) != value[5]._M_parent) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_950,"ATTACHED_FILES_ON_FAIL",(allocator<char> *)&backtrace);
        DumpToJsonArray(&local_3a0,
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(value + 5));
        DumpCTestProperty((Value *)&commandAndArgs,(string *)&local_950,&local_3a0);
        Json::Value::append(&properties,(Value *)&commandAndArgs);
        Json::Value::~Value((Value *)&commandAndArgs);
        Json::Value::~Value(&local_3a0);
        std::__cxx11::string::~string((string *)&local_950);
      }
      if (value[4]._M_parent !=
          (_Base_ptr)
          ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)&value[4]._M_left)->_M_allocated_capacity) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_950,"ATTACHED_FILES",(allocator<char> *)&backtrace);
        DumpToJsonArray(&local_3c8,
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&value[4]._M_parent);
        DumpCTestProperty((Value *)&commandAndArgs,(string *)&local_950,&local_3c8);
        Json::Value::append(&properties,(Value *)&commandAndArgs);
        Json::Value::~Value((Value *)&commandAndArgs);
        Json::Value::~Value(&local_3c8);
        std::__cxx11::string::~string((string *)&local_950);
      }
      fVar1 = *(float *)((long)&value[9]._M_left + 4);
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_950,"COST",(allocator<char> *)&backtrace);
        Json::Value::Value(&local_3f0,(double)*(float *)((long)&value[9]._M_left + 4));
        DumpCTestProperty((Value *)&commandAndArgs,(string *)&local_950,&local_3f0);
        Json::Value::append(&properties,(Value *)&commandAndArgs);
        Json::Value::~Value((Value *)&commandAndArgs);
        Json::Value::~Value(&local_3f0);
        std::__cxx11::string::~string((string *)&local_950);
      }
      if ((_Base_ptr)
          ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)&value[3]._M_left)->_M_allocated_capacity != value[3]._M_right) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_950,"DEPENDS",(allocator<char> *)&backtrace);
        DumpToJsonArray(&local_418,
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&value[3]._M_left);
        DumpCTestProperty((Value *)&commandAndArgs,(string *)&local_950,&local_418);
        Json::Value::append(&properties,(Value *)&commandAndArgs);
        Json::Value::~Value((Value *)&commandAndArgs);
        Json::Value::~Value(&local_418);
        std::__cxx11::string::~string((string *)&local_950);
      }
      if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)&value[9]._M_left)->_M_local_buf[2] == '\x01') {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_950,"DISABLED",(allocator<char> *)&backtrace);
        Json::Value::Value(&local_440,
                           (bool)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)&value[9]._M_left)->_M_local_buf[2]);
        DumpCTestProperty((Value *)&commandAndArgs,(string *)&local_950,&local_440);
        Json::Value::append(&properties,(Value *)&commandAndArgs);
        Json::Value::~Value((Value *)&commandAndArgs);
        Json::Value::~Value(&local_440);
        std::__cxx11::string::~string((string *)&local_950);
      }
      if (value[0xc]._M_parent !=
          (_Base_ptr)
          ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)&value[0xc]._M_left)->_M_allocated_capacity) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_950,"ENVIRONMENT",(allocator<char> *)&backtrace);
        DumpToJsonArray(&local_468,
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&value[0xc]._M_parent);
        DumpCTestProperty((Value *)&commandAndArgs,(string *)&local_950,&local_468);
        Json::Value::append(&properties,(Value *)&commandAndArgs);
        Json::Value::~Value((Value *)&commandAndArgs);
        Json::Value::~Value(&local_468);
        std::__cxx11::string::~string((string *)&local_950);
      }
      if (value[5]._M_right != *(_Base_ptr *)(value + 6)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_950,"FAIL_REGULAR_EXPRESSION",(allocator<char> *)&backtrace);
        DumpRegExToJsonArray
                  (&local_490,
                   (vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&value[5]._M_right);
        DumpCTestProperty((Value *)&commandAndArgs,(string *)&local_950,&local_490);
        Json::Value::append(&properties,(Value *)&commandAndArgs);
        Json::Value::~Value((Value *)&commandAndArgs);
        Json::Value::~Value(&local_490);
        std::__cxx11::string::~string((string *)&local_950);
      }
      if (*(long *)(value + 0x12) != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_950,"FIXTURES_CLEANUP",(allocator<char> *)&backtrace);
        DumpToJsonArray(&local_4b8,
                        (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&value[0x10]._M_right);
        DumpCTestProperty((Value *)&commandAndArgs,(string *)&local_950,&local_4b8);
        Json::Value::append(&properties,(Value *)&commandAndArgs);
        Json::Value::~Value((Value *)&commandAndArgs);
        Json::Value::~Value(&local_4b8);
        std::__cxx11::string::~string((string *)&local_950);
      }
      if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)&value[0x13]._M_left)->_M_allocated_capacity != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_950,"FIXTURES_REQUIRED",(allocator<char> *)&backtrace);
        DumpToJsonArray(&local_4e0,
                        (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&value[0x12]._M_parent);
        DumpCTestProperty((Value *)&commandAndArgs,(string *)&local_950,&local_4e0);
        Json::Value::append(&properties,(Value *)&commandAndArgs);
        Json::Value::~Value((Value *)&commandAndArgs);
        Json::Value::~Value(&local_4e0);
        std::__cxx11::string::~string((string *)&local_950);
      }
      if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)&value[0x10]._M_left)->_M_allocated_capacity != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_950,"FIXTURES_SETUP",(allocator<char> *)&backtrace);
        DumpToJsonArray(&local_508,
                        (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&value[0xf]._M_parent);
        DumpCTestProperty((Value *)&commandAndArgs,(string *)&local_950,&local_508);
        Json::Value::append(&properties,(Value *)&commandAndArgs);
        Json::Value::~Value((Value *)&commandAndArgs);
        Json::Value::~Value(&local_508);
        std::__cxx11::string::~string((string *)&local_950);
      }
      if (*(_Base_ptr *)(value + 0xd) != value[0xd]._M_parent) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_950,"LABELS",(allocator<char> *)&backtrace);
        DumpToJsonArray(&local_530,
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(value + 0xd));
        DumpCTestProperty((Value *)&commandAndArgs,(string *)&local_950,&local_530);
        Json::Value::append(&properties,(Value *)&commandAndArgs);
        Json::Value::~Value((Value *)&commandAndArgs);
        Json::Value::~Value(&local_530);
        std::__cxx11::string::~string((string *)&local_950);
      }
      if (value[9]._M_parent != (_Base_ptr)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_870,"MEASUREMENT",(allocator<char> *)&local_760);
        Json::Value::Value(&local_7f8,arrayValue);
        for (p_Var6 = value[8]._M_right; p_Var6 != (_Rb_tree_node_base *)&value[8]._M_parent;
            p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
          Json::Value::Value((Value *)&commandAndArgs,objectValue);
          Json::Value::Value(&local_950,(string *)(p_Var6 + 1));
          pVVar5 = Json::Value::operator[]((Value *)&commandAndArgs,"measurement");
          Json::Value::operator=(pVVar5,&local_950);
          Json::Value::~Value(&local_950);
          Json::Value::Value((Value *)&backtrace,(string *)(p_Var6 + 2));
          pVVar5 = Json::Value::operator[]((Value *)&commandAndArgs,"value");
          Json::Value::operator=(pVVar5,(Value *)&backtrace);
          Json::Value::~Value((Value *)&backtrace);
          Json::Value::append(&local_7f8,(Value *)&commandAndArgs);
          Json::Value::~Value((Value *)&commandAndArgs);
        }
        DumpCTestProperty(&local_7d0,(string *)&local_870,&local_7f8);
        Json::Value::append(&properties,&local_7d0);
        Json::Value::~Value(&local_7d0);
        Json::Value::~Value(&local_7f8);
        std::__cxx11::string::~string((string *)&local_870);
      }
      if ((_Base_ptr)
          ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)&value[6]._M_left)->_M_allocated_capacity != value[6]._M_right) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_950,"PASS_REGULAR_EXPRESSION",(allocator<char> *)&local_7d0);
        DumpRegExToJsonArray
                  ((Value *)&backtrace,
                   (vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&value[6]._M_left);
        DumpCTestProperty((Value *)&commandAndArgs,(string *)&local_950,(Value *)&backtrace);
        Json::Value::append(&properties,(Value *)&commandAndArgs);
        Json::Value::~Value((Value *)&commandAndArgs);
        Json::Value::~Value((Value *)&backtrace);
        std::__cxx11::string::~string((string *)&local_950);
      }
      if (*(char *)&((_Alloc_hider *)&value[0xb]._M_color)->_M_p == '\x01') {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_950,"PROCESSOR_AFFINITY",(allocator<char> *)&local_870);
        Json::Value::Value(&local_7d0,*(bool *)&((_Alloc_hider *)&value[0xb]._M_color)->_M_p);
        DumpCTestProperty((Value *)&commandAndArgs,(string *)&local_950,&local_7d0);
        Json::Value::append(&properties,(Value *)&commandAndArgs);
        Json::Value::~Value((Value *)&commandAndArgs);
        Json::Value::~Value(&local_7d0);
        std::__cxx11::string::~string((string *)&local_950);
      }
      if (*(int *)((long)&value[10]._M_right + 4) != 1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_950,"PROCESSORS",(allocator<char> *)&local_760);
        Json::Value::Value(&local_870,*(Int *)((long)&value[10]._M_right + 4));
        DumpCTestProperty((Value *)&commandAndArgs,(string *)&local_950,&local_870);
        Json::Value::append(&properties,(Value *)&commandAndArgs);
        Json::Value::~Value((Value *)&commandAndArgs);
        Json::Value::~Value(&local_870);
        std::__cxx11::string::~string((string *)&local_950);
      }
      if (value[2]._M_right != *(_Base_ptr *)(value + 3)) {
        DumpToJsonArray(&local_760,
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&value[2]._M_right);
        pVVar5 = Json::Value::operator[](&properties,"REQUIRED_FILES");
        Json::Value::operator=(pVVar5,&local_760);
        Json::Value::~Value(&local_760);
      }
      if (*(long *)(value + 0xf) != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_950,"RESOURCE_LOCK",(allocator<char> *)&local_648);
        DumpToJsonArray(&local_558,
                        (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&value[0xd]._M_right);
        DumpCTestProperty((Value *)&commandAndArgs,(string *)&local_950,&local_558);
        Json::Value::append(&properties,(Value *)&commandAndArgs);
        Json::Value::~Value((Value *)&commandAndArgs);
        Json::Value::~Value(&local_558);
        std::__cxx11::string::~string((string *)&local_950);
      }
      if (*(char *)((long)&value[9]._M_right + 4) == '\x01') {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_950,"RUN_SERIAL",(allocator<char> *)&local_670);
        Json::Value::Value(&local_648,*(bool *)((long)&value[9]._M_right + 4));
        DumpCTestProperty((Value *)&commandAndArgs,(string *)&local_950,&local_648);
        Json::Value::append(&properties,(Value *)&commandAndArgs);
        Json::Value::~Value((Value *)&commandAndArgs);
        Json::Value::~Value(&local_648);
        std::__cxx11::string::~string((string *)&local_950);
      }
      if (*(int *)&((_Alloc_hider *)&value[0xc]._M_color)->_M_p != -1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_950,"SKIP_RETURN_CODE",(allocator<char> *)&local_698);
        Json::Value::Value(&local_670,*(Int *)&((_Alloc_hider *)&value[0xc]._M_color)->_M_p);
        DumpCTestProperty((Value *)&commandAndArgs,(string *)&local_950,&local_670);
        Json::Value::append(&properties,(Value *)&commandAndArgs);
        Json::Value::~Value((Value *)&commandAndArgs);
        Json::Value::~Value(&local_670);
        std::__cxx11::string::~string((string *)&local_950);
      }
      if (*(char *)&value[10]._M_parent == '\x01') {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_950,"TIMEOUT",(allocator<char> *)&local_8e8);
        Json::Value::Value(&local_698,*(double *)(value + 10));
        DumpCTestProperty((Value *)&commandAndArgs,(string *)&local_950,&local_698);
        Json::Value::append(&properties,(Value *)&commandAndArgs);
        Json::Value::~Value((Value *)&commandAndArgs);
        Json::Value::~Value(&local_698);
        std::__cxx11::string::~string((string *)&local_950);
      }
      if (value[7]._M_parent !=
          (_Base_ptr)
          ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)&value[7]._M_left)->_M_allocated_capacity) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_920,"TIMEOUT_AFTER_MATCH",&local_9a9);
        Json::Value::Value(&local_820,objectValue);
        Json::Value::Value((Value *)&commandAndArgs,
                           (double)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)&value[10]._M_left)->_M_allocated_capacity);
        pVVar5 = Json::Value::operator[](&local_820,"timeout");
        Json::Value::operator=(pVVar5,(Value *)&commandAndArgs);
        Json::Value::~Value((Value *)&commandAndArgs);
        DumpRegExToJsonArray
                  (&local_950,
                   (vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&value[7]._M_parent);
        pVVar5 = Json::Value::operator[](&local_820,"regex");
        Json::Value::operator=(pVVar5,&local_950);
        Json::Value::~Value(&local_950);
        DumpCTestProperty(&local_8e8,&local_920,&local_820);
        Json::Value::append(&properties,&local_8e8);
        Json::Value::~Value(&local_8e8);
        Json::Value::~Value(&local_820);
        std::__cxx11::string::~string((string *)&local_920);
      }
      if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)&value[9]._M_left)->_M_local_buf[1] == '\x01') {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_8e8,"WILL_FAIL",(allocator<char> *)&local_920);
        Json::Value::Value(&local_950,
                           (bool)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)&value[9]._M_left)->_M_local_buf[1]);
        DumpCTestProperty((Value *)&commandAndArgs,(string *)&local_8e8,&local_950);
        Json::Value::append(&properties,(Value *)&commandAndArgs);
        Json::Value::~Value((Value *)&commandAndArgs);
        Json::Value::~Value(&local_950);
        std::__cxx11::string::~string((string *)&local_8e8);
      }
      if (value[1]._M_parent != (_Base_ptr)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_920,"WORKING_DIRECTORY",&local_9a9);
        Json::Value::Value(&local_8e8,(string *)local_8f8);
        DumpCTestProperty((Value *)&commandAndArgs,&local_920,&local_8e8);
        Json::Value::append(&properties,(Value *)&commandAndArgs);
        Json::Value::~Value((Value *)&commandAndArgs);
        Json::Value::~Value(&local_8e8);
        std::__cxx11::string::~string((string *)&local_920);
      }
      bVar3 = Json::Value::empty(&properties);
      if (!bVar3) {
        Json::Value::Value(&local_950,&properties);
        pVVar5 = Json::Value::operator[](&testInfo,"properties");
        Json::Value::operator=(pVVar5,&local_950);
        Json::Value::~Value(&local_950);
      }
      bVar3 = cmListFileBacktrace::Empty((cmListFileBacktrace *)&value[0x15]._M_parent);
      if (!bVar3) {
        bVar3 = BacktraceData::Add(&backtraceGraph,(cmListFileBacktrace *)&value[0x15]._M_parent,
                                   &backtrace);
        if (bVar3) {
          Json::Value::Value((Value *)&commandAndArgs,backtrace);
          pVVar5 = Json::Value::operator[](&testInfo,"backtrace");
          Json::Value::operator=(pVVar5,(Value *)&commandAndArgs);
          Json::Value::~Value((Value *)&commandAndArgs);
        }
      }
      Json::Value::~Value(&properties);
      Json::Value::append(&tests,&testInfo);
      Json::Value::~Value(&testInfo);
    }
    else {
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (*(long *)(value + 2) + 0x20),"NOT_AVAILABLE");
      if (!bVar3) goto LAB_001aa447;
    }
    cmCTestRunTest::~cmCTestRunTest((cmCTestRunTest *)&builder);
    cmWorkingDirectory::~cmWorkingDirectory(&workdir);
    p_Var7 = (_Base_ptr)std::_Rb_tree_increment(local_8f0);
  } while( true );
}

Assistant:

void cmCTestMultiProcessHandler::PrintOutputAsJson()
{
  this->TestHandler->SetMaxIndex(this->FindMaxIndex());

  Json::Value result = Json::objectValue;
  result["kind"] = "ctestInfo";
  result["version"] = DumpVersion(1, 0);

  BacktraceData backtraceGraph;
  Json::Value tests = Json::arrayValue;
  for (auto& it : this->Properties) {
    cmCTestTestHandler::cmCTestTestProperties& p = *it.second;

    // Don't worry if this fails, we are only showing the test list, not
    // running the tests
    cmWorkingDirectory workdir(p.Directory);
    cmCTestRunTest testRun(*this);
    testRun.SetIndex(p.Index);
    testRun.SetTestProperties(&p);
    testRun.ComputeArguments();

    // Skip tests not available in this configuration.
    if (p.Args.size() >= 2 && p.Args[1] == "NOT_AVAILABLE") {
      continue;
    }

    Json::Value testInfo = DumpCTestInfo(testRun, p, backtraceGraph);
    tests.append(testInfo);
  }
  result["backtraceGraph"] = backtraceGraph.Dump();
  result["tests"] = std::move(tests);

  Json::StreamWriterBuilder builder;
  builder["indentation"] = "  ";
  std::unique_ptr<Json::StreamWriter> jout(builder.newStreamWriter());
  jout->write(result, &std::cout);
}